

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

const_reference __thiscall
duckdb::vector<bool,_true>::get<true>(vector<bool,_true> *this,size_type __n)

{
  ulong params_1;
  long lVar1;
  InternalException *this_00;
  size_type sVar2;
  string local_48;
  
  lVar1 = (long)(this->super_vector<bool,_std::allocator<bool>_>).
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p;
  params_1 = (ulong)(this->super_vector<bool,_std::allocator<bool>_>).
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_offset +
             ((long)(this->super_vector<bool,_std::allocator<bool>_>).
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_p - lVar1) * 8;
  if (__n < params_1) {
    sVar2 = __n + 0x3f;
    if (-1 < (long)__n) {
      sVar2 = __n;
    }
    return (*(ulong *)(lVar1 + ((long)sVar2 >> 6) * 8 + -8 +
                      (ulong)((__n & 0x800000000000003f) < 0x8000000000000001) * 8) >> (__n & 0x3f)
           & 1) != 0;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Attempted to access index %ld within vector of size %ld","");
  InternalException::InternalException<unsigned_long,unsigned_long>(this_00,&local_48,__n,params_1);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline typename original::const_reference get(typename original::size_type __n) const { // NOLINT: hiding on purpose
		if (MemorySafety<INTERNAL_SAFE>::ENABLED) {
			AssertIndexInBounds(__n, original::size());
		}
		return original::operator[](__n);
	}